

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

CoinSelectionOption * GetElementsOption(void)

{
  CoinSelectionOption *in_RDI;
  CoinSelectionOption *option;
  CoinSelectionOption *in_stack_00000330;
  
  cfd::CoinSelectionOption::CoinSelectionOption(in_RDI);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_00000330);
  return in_RDI;
}

Assistant:

static CoinSelectionOption GetElementsOption() {
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  return option;
}